

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O3

void zhash_map_values(zhash_t *zh,_func_void_varargs *f)

{
  long lVar1;
  int iVar2;
  zhash_t *zh_1;
  
  if (zh == (zhash_t *)0x0) {
    __assert_fail("zh != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                  ,0x185,"void zhash_map_values(zhash_t *, void (*)())");
  }
  if (f == (_func_void_varargs *)0x0) {
    return;
  }
  iVar2 = -1;
  do {
    do {
      iVar2 = iVar2 + 1;
      if (zh->nentries <= iVar2) {
        return;
      }
      lVar1 = (long)iVar2 * (long)zh->entrysz;
    } while (zh->entries[lVar1] == '\0');
    (*f)(zh->entries + lVar1 + zh->keysz + 1);
  } while( true );
}

Assistant:

void zhash_map_values(zhash_t * zh, void (*f)())
{
    assert(zh != NULL);
    if (f == NULL)
        return;

    zhash_iterator_t itr;
    zhash_iterator_init(zh, &itr);

    void *key, *value;
    while(zhash_iterator_next_volatile(&itr, &key, &value)) {
        f(value);
    }
}